

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  FileDescriptorProto *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__a;
  long in_RSI;
  long in_RDI;
  UnknownFieldSet *in_stack_fffffffffffffeb8;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *in_stack_fffffffffffffec0;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_fffffffffffffef0;
  RepeatedField<int> *in_stack_ffffffffffffff78;
  RepeatedField<int> *in_stack_ffffffffffffff80;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_004f0ec8;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(in_stack_fffffffffffffef0);
  }
  internal::InternalMetadataWithArena::DoSwap
            ((InternalMetadataWithArena *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
LAB_004f0ec8:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x10),(uint *)(in_RSI + 0x10));
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec0,
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffeb8);
  RepeatedPtrField<google::protobuf::DescriptorProto>::InternalSwap
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_fffffffffffffec0,
             (RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_fffffffffffffeb8);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::InternalSwap
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_fffffffffffffec0,
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_fffffffffffffeb8);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::InternalSwap
            ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)in_stack_fffffffffffffec0
             ,(RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
              in_stack_fffffffffffffeb8);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::InternalSwap
            (in_stack_fffffffffffffec0,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_fffffffffffffeb8);
  RepeatedField<int>::InternalSwap(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  RepeatedField<int>::InternalSwap(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_01 = (FileDescriptorProto *)(in_RDI + 0xb0);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0xb0));
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0xb8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0xb8));
  __a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0xc0);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            (__a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (in_RSI + 0xc0));
  std::swap<google::protobuf::FileOptions*>
            ((FileOptions **)(in_RDI + 200),(FileOptions **)(in_RSI + 200));
  std::swap<google::protobuf::SourceCodeInfo*>
            ((SourceCodeInfo **)(in_RDI + 0xd0),(SourceCodeInfo **)(in_RSI + 0xd0));
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  package_.Swap(&other->package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  syntax_.Swap(&other->syntax_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
  swap(source_code_info_, other->source_code_info_);
}